

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkSets.c
# Opt level: O2

void Lpk_PrintSets(Vec_Int_t *vSets)

{
  int uSupport;
  int i;
  
  printf("Subsets(%d): ",(ulong)(uint)vSets->nSize);
  for (i = 0; i < vSets->nSize; i = i + 1) {
    uSupport = Vec_IntEntry(vSets,i);
    Lpk_PrintSetOne(uSupport);
  }
  putchar(10);
  return;
}

Assistant:

static void Lpk_PrintSets( Vec_Int_t * vSets )
{
    unsigned uSupport;
    int Number, i;
    printf( "Subsets(%d): ", Vec_IntSize(vSets) );
    Vec_IntForEachEntry( vSets, Number, i )
    {
        uSupport = Number;
        Lpk_PrintSetOne( uSupport );
    }
    printf( "\n" );
}